

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

void __thiscall cooper::timer::thread_func(timer *this)

{
  cv_status cVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  unique_guard g;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = (mutex_type *)(this + 0x30);
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  lVar2 = *(long *)(this + 0x90);
  if (*(long *)(this + 0x88) != lVar2 && *(long *)(this + 0x88) != 0) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    local_48.__d.__r = (duration)(lVar2 + *(long *)(this + 0x88));
    cVar1 = std::condition_variable::
            __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((condition_variable *)(this + 0x58),&local_40,&local_48);
    if ((cVar1 == no_timeout) || (((byte)this[0x98] & 1) != 0)) goto LAB_001067d0;
    std::unique_lock<std::mutex>::unlock(&local_40);
    if (*(long *)(this + 0x18) == 0) {
LAB_001067ee:
      uVar3 = std::__throw_bad_function_call();
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      _Unwind_Resume(uVar3);
    }
    (**(code **)(this + 0x20))(this + 8);
    std::unique_lock<std::mutex>::lock(&local_40);
    lVar2 = *(long *)(this + 0x90);
  }
  if (lVar2 != 0) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    local_48.__d.__r = (duration)(lVar2 + *(long *)(this + 0x90));
    if (((byte)this[0x98] & 1) == 0) {
      do {
        cVar1 = std::condition_variable::
                __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          ((condition_variable *)(this + 0x58),&local_40,&local_48);
        if ((cVar1 == no_timeout) || (((byte)this[0x98] & 1) != 0)) break;
        std::unique_lock<std::mutex>::unlock(&local_40);
        if (*(long *)(this + 0x18) == 0) {
          std::__throw_bad_function_call();
          goto LAB_001067ee;
        }
        (**(code **)(this + 0x20))(this + 8);
        std::unique_lock<std::mutex>::lock(&local_40);
        lVar4 = *(long *)(this + 0x90) + (long)local_48.__d.__r;
        lVar2 = std::chrono::_V2::steady_clock::now();
        local_48.__d.__r = (duration)(duration)lVar4;
        if (lVar4 <= lVar2) {
          local_48.__d.__r = (duration)(duration)lVar2;
        }
      } while (((byte)this[0x98] & 1) == 0);
    }
  }
LAB_001067d0:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void timer::thread_func()
{
	unique_guard g(lock_);
	if (initTime_.count() != 0 && initTime_.count() != interval_.count()) {
		if (cond_.wait_for(g, initTime_) == cv_status::no_timeout || quit_)
			return;
		g.unlock();
		func_();
		g.lock();
	}

	// If this was a one-shot, get out now.
	if (interval_.count() == 0)
		return;

	auto to = steady_clock::now() + interval_;

	while (!quit_) {
		if (cond_.wait_until(g, to) == cv_status::no_timeout || quit_)
			return;
		g.unlock();
		func_();
		g.lock();
		to = std::max(to+interval_, steady_clock::now());
	}
}